

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

void __thiscall CCoinsViewCache::ReallocateCache(CCoinsViewCache *this)

{
  size_type sVar1;
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  *in_RDI;
  long in_FS_OFFSET;
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  *in_stack_ffffffffffffffa8;
  PoolResource<144UL,_8UL> *this_00;
  key_equal *__eql;
  PoolResource<144UL,_8UL> *in_stack_ffffffffffffffb8;
  hasher *__hf;
  undefined1 *__n;
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  *puVar2;
  undefined1 deterministic;
  SaltedOutpointHasher *in_stack_ffffffffffffffd8;
  hasher local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = in_RDI;
  sVar1 = std::
          unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
          ::size(in_stack_ffffffffffffffa8);
  deterministic = (undefined1)((ulong)puVar2 >> 0x38);
  if (sVar1 != 0) {
    __assert_fail("cacheCoins.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/coins.cpp"
                  ,0x138,"void CCoinsViewCache::ReallocateCache()");
  }
  __eql = (key_equal *)&in_RDI[4]._M_h._M_element_count;
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::~unordered_map(in_stack_ffffffffffffffa8);
  this_00 = (PoolResource<144UL,_8UL> *)&(in_RDI->_M_h)._M_rehash_policy;
  PoolResource<144UL,_8UL>::~PoolResource(in_stack_ffffffffffffffb8);
  PoolResource<144UL,_8UL>::PoolResource(this_00);
  __hf = &local_18;
  SaltedOutpointHasher::SaltedOutpointHasher(in_stack_ffffffffffffffd8,(bool)deterministic);
  __n = &stack0xffffffffffffffd8;
  PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>::PoolAllocator
            ((PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL> *)this_00,
             (ResourceType *)0x806887);
  std::
  unordered_map<COutPoint,_CCoinsCacheEntry,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_PoolAllocator<std::pair<const_COutPoint,_CCoinsCacheEntry>,_144UL,_8UL>_>
  ::unordered_map(in_RDI,(size_type)__n,__hf,__eql,(allocator_type *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCoinsViewCache::ReallocateCache()
{
    // Cache should be empty when we're calling this.
    assert(cacheCoins.size() == 0);
    cacheCoins.~CCoinsMap();
    m_cache_coins_memory_resource.~CCoinsMapMemoryResource();
    ::new (&m_cache_coins_memory_resource) CCoinsMapMemoryResource{};
    ::new (&cacheCoins) CCoinsMap{0, SaltedOutpointHasher{/*deterministic=*/m_deterministic}, CCoinsMap::key_equal{}, &m_cache_coins_memory_resource};
}